

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSphereTriangleCollisionAlgorithm.h
# Opt level: O3

void __thiscall
btSphereTriangleCollisionAlgorithm::getAllContactManifolds
          (btSphereTriangleCollisionAlgorithm *this,btManifoldArray *manifoldArray)

{
  uint uVar1;
  btPersistentManifold **ppbVar2;
  btPersistentManifold *pbVar3;
  ulong uVar4;
  int iVar5;
  
  pbVar3 = this->m_manifoldPtr;
  if ((pbVar3 != (btPersistentManifold *)0x0) && (this->m_ownManifold == true)) {
    uVar1 = manifoldArray->m_size;
    if (uVar1 == manifoldArray->m_capacity) {
      iVar5 = 1;
      if (uVar1 != 0) {
        iVar5 = uVar1 * 2;
      }
      if ((int)uVar1 < iVar5) {
        if (iVar5 == 0) {
          ppbVar2 = (btPersistentManifold **)0x0;
        }
        else {
          ppbVar2 = (btPersistentManifold **)btAlignedAllocInternal((long)iVar5 << 3,0x10);
          uVar1 = manifoldArray->m_size;
        }
        if (0 < (int)uVar1) {
          uVar4 = 0;
          do {
            ppbVar2[uVar4] = manifoldArray->m_data[uVar4];
            uVar4 = uVar4 + 1;
          } while (uVar1 != uVar4);
        }
        if ((manifoldArray->m_data != (btPersistentManifold **)0x0) &&
           (manifoldArray->m_ownsMemory == true)) {
          btAlignedFreeInternal(manifoldArray->m_data);
          uVar1 = manifoldArray->m_size;
        }
        manifoldArray->m_ownsMemory = true;
        manifoldArray->m_data = ppbVar2;
        manifoldArray->m_capacity = iVar5;
        pbVar3 = this->m_manifoldPtr;
      }
    }
    manifoldArray->m_data[(int)uVar1] = pbVar3;
    manifoldArray->m_size = uVar1 + 1;
  }
  return;
}

Assistant:

virtual	void	getAllContactManifolds(btManifoldArray&	manifoldArray)
	{
		if (m_manifoldPtr && m_ownManifold)
		{
			manifoldArray.push_back(m_manifoldPtr);
		}
	}